

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unnamed_pipe.c
# Opt level: O1

int main(void)

{
  __pid_t _Var1;
  undefined8 in_RAX;
  FILE *ui;
  char *uis;
  int fds [2];
  undefined8 local_8;
  
  local_8 = in_RAX;
  pipe((int *)&local_8);
  _Var1 = fork();
  if (_Var1 == 0) {
    close(local_8._4_4_);
    uis = "r";
    ui = fdopen((int)local_8,"r");
    reader((UI *)ui,(UI_STRING *)uis);
    local_8._4_4_ = (int)local_8;
  }
  else {
    close((int)local_8);
    fdopen(local_8._4_4_,"w");
    writer((UI *)"Hello, world.",(UI_STRING *)0x3);
  }
  close(local_8._4_4_);
  return 0;
}

Assistant:

int main () 
{
    FILE * stream;
    /* Create pipe place the two ends pipe file descriptors in fds */
    int fds[2];
    pipe(fds);
    pid_t pid = fork();
    if(pid == (pid_t) 0) 
    {/* Child process (consumer) */
        close(fds[1]);         
        /* Close the copy of the fds write end */
        stream = fdopen(fds[0], "r");
        reader(stream);
        close(fds[0]);
        
    }
    else 
    {                   
        /* Parent process (producer)  */
        close(fds[0]);         
        /* Close the copy of the fds read end */
        stream = fdopen(fds[1], "w");
        writer("Hello, world.", 3, stream);
        close(fds[1]);
    }
    return 0;
    
}